

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<char*&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char **args)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char **args_01;
  v8 *this_00;
  log_msg *in_RDI;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *in_R8;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_01;
  logger *in_stack_fffffffffffffb98;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffba0;
  undefined1 *puVar1;
  level_enum lvl_00;
  string_view_t in_stack_fffffffffffffc08;
  string_view_t in_stack_fffffffffffffc18;
  source_loc in_stack_fffffffffffffc30;
  basic_string_view<char> local_368;
  buffer<char> *in_stack_fffffffffffffca8;
  locale_ref in_stack_fffffffffffffcb0;
  unsigned_long_long in_stack_fffffffffffffcb8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  locale_ref local_2d0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *local_2c8 [2];
  undefined8 local_2b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  v8 local_279;
  buffer<char> local_278 [9];
  undefined1 local_152;
  byte local_151;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> *local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_20;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char_*> **local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  puVar1 = &stack0x00000008;
  local_150 = in_R8;
  local_138 = in_RDX;
  uStack_130 = in_RCX;
  local_151 = should_log(in_stack_fffffffffffffb98,
                         (level_enum)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  local_152 = details::backtracer::enabled((backtracer *)0x28431b);
  if (((local_151 & 1) != 0) || ((bool)local_152)) {
    this_00 = &local_279;
    std::allocator<char>::allocator();
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb90,(allocator<char> *)in_stack_fffffffffffffb88);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    local_2a8 = local_138;
    uStack_2a0 = uStack_130;
    local_2c8[0] = ::fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char*&>
                             (local_150,this_00,args_01);
    local_28 = &local_2b8;
    local_30 = local_2c8;
    local_10 = 0xc;
    local_2b8 = 0xc;
    local_20 = local_30;
    local_18 = local_30;
    local_8 = local_28;
    local_2b0 = local_30;
    ::fmt::v8::detail::locale_ref::locale_ref(&local_2d0);
    fmt_00.size_ = in_stack_fffffffffffffcd0;
    fmt_00.data_ = in_stack_fffffffffffffcc8;
    args_00.field_1.values_ = in_stack_fffffffffffffcc0.values_;
    args_00.desc_ = in_stack_fffffffffffffcb8;
    ::fmt::v8::detail::vformat_to<char>
              (in_stack_fffffffffffffca8,fmt_00,args_00,in_stack_fffffffffffffcb0);
    log_msg_00 = *(log_msg **)(puVar1 + 0x10);
    this_01 = *(basic_memory_buffer<char,_250UL,_std::allocator<char>_> **)(puVar1 + 8);
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    lvl_00 = (level_enum)((ulong)puVar1 >> 0x20);
    s = ::fmt::v8::detail::buffer<char>::data(local_278);
    count = ::fmt::v8::detail::buffer<char>::size(local_278);
    ::fmt::v8::basic_string_view<char>::basic_string_view(&local_368,s,count);
    details::log_msg::log_msg
              (in_RDI,in_stack_fffffffffffffc30,in_stack_fffffffffffffc18,lvl_00,
               in_stack_fffffffffffffc08);
    log_it_(in_stack_fffffffffffffba0,log_msg_00,SUB81((ulong)this_01 >> 0x38,0),
            SUB81((ulong)this_01 >> 0x30,0));
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_01);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
#ifdef SPDLOG_USE_STD_FORMAT
            memory_buf_t buf = std::vformat(fmt, std::make_format_args(std::forward<Args>(args)...));
#else
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }